

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

string * __thiscall
kratos::SystemVerilogCodeGen::get_width_str_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Var *var)

{
  VarType VVar1;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  char **format_str;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str_00;
  v7 local_f0 [32];
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_d0;
  string local_b8 [8];
  string format;
  Var *var_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_88;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  format.field_2._8_8_ = this;
  std::__cxx11::string::string(local_b8);
  VVar1 = Var::type((Var *)format.field_2._8_8_);
  if (VVar1 == Parameter) {
    std::__cxx11::string::operator=(local_b8,"[{0}-1:0]");
  }
  else {
    std::__cxx11::string::operator=(local_b8,"[({0})-1:0]");
  }
  local_d0.long_long_value = std::__cxx11::string::c_str();
  (**(code **)(*(long *)format.field_2._8_8_ + 0xf8))(local_f0);
  local_40 = &local_d0;
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_f0;
  local_38 = __return_storage_ptr__;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string,char_const*,char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40->string,(v7 *)vargs,format_str,in_RCX);
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>
                       (((arg_data<fmt::v7::detail::value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>,_char,_1UL,_0UL>
                          *)&(local_40->string).data)->args_[0].field_0.string.data);
  local_28 = &local_88;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_88.field_1.values_;
  format_str_00.size_ = local_88.desc_;
  format_str_00.data_ = (char *)local_78.size_;
  fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)local_78.data_,format_str_00,args);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string(local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::get_width_str(Var* var) {
    std::string format;
    if (var->type() == VarType::Parameter)
        format = "[{0}-1:0]";
    else
        format = "[({0})-1:0]";
    return ::format(format.c_str(), var->to_string());
}